

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O2

void __thiscall BackgroundParser::JobProcessed(BackgroundParser *this,Job *job,bool succeeded)

{
  uint uVar1;
  uint uVar2;
  CompileScriptException *pCVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined7 in_register_00000011;
  
  RemoveFromUnprocessedItems(this,(BackgroundParseItem *)job);
  this->pendingBackgroundItems = this->pendingBackgroundItems - 1;
  if ((int)CONCAT71(in_register_00000011,succeeded) == 0) {
    iVar6 = *(int *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                     previous;
    if ((-1 < iVar6) && (this->failedBackgroundParseItem == (BackgroundParseItem *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                         ,0x76,
                         "(((HRESULT)(backgroundItem->GetHR())<0) || failedBackgroundParseItem)",
                         "FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
      iVar6 = *(int *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                       previous;
    }
    if (iVar6 < 0) {
      if (this->failedBackgroundParseItem != (BackgroundParseItem *)0x0) {
        pCVar3 = this->failedBackgroundParseItem->pse;
        uVar1 = pCVar3->line;
        uVar2 = job[4].manager[1].numJobsAddedToProcessor;
        if ((int)uVar1 <= (int)uVar2) {
          if (uVar2 != uVar1) {
            return;
          }
          if (pCVar3->ichMinLine <= *(int *)&job[4].manager[1].isWaitable) {
            return;
          }
        }
      }
      this->failedBackgroundParseItem = (BackgroundParseItem *)job;
    }
  }
  return;
}

Assistant:

void BackgroundParser::JobProcessed(JsUtil::Job *const job, const bool succeeded)
{
    // This is called from inside a lock, so we can mess with background parser attributes.
    BackgroundParseItem *backgroundItem = static_cast<BackgroundParseItem*>(job);
    this->RemoveFromUnprocessedItems(backgroundItem);
    --this->pendingBackgroundItems;
    if (!succeeded)
    {
        Assert(FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem);

        if (FAILED(backgroundItem->GetHR()))
        {
            if (!failedBackgroundParseItem)
            {
                failedBackgroundParseItem = backgroundItem;
            }
            else
            {
                // If syntax errors are detected on multiple threads, the lexically earlier one should win.
                CompileScriptException *newPse = backgroundItem->GetPSE();
                CompileScriptException *oldPse = failedBackgroundParseItem->GetPSE();

                if (newPse->line < oldPse->line ||
                    (newPse->line == oldPse->line && newPse->ichMinLine < oldPse->ichMinLine))
                {
                    failedBackgroundParseItem = backgroundItem;
                }
            }
        }
    }
}